

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c++
# Opt level: O0

Promise<void> __thiscall
kj::TlsConnection::writeInternal
          (TlsConnection *this,ArrayPtr<const_unsigned_char> first,
          ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> rest)

{
  bool bVar1;
  size_t sVar2;
  ArrayPtr<const_unsigned_char> *pAVar3;
  Type *func;
  ArrayPtr<const_unsigned_char> *in_R9;
  undefined1 local_98 [48];
  Fault f;
  undefined1 local_60 [8];
  DebugComparison<kj::Maybe<kj::Promise<void>_>_&,_const_kj::None_&> _kjCondition;
  TlsConnection *this_local;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> rest_local;
  ArrayPtr<const_unsigned_char> first_local;
  
  this_local = (TlsConnection *)rest.size_;
  rest_local.size_ = first.size_;
  func = (Type *)first.ptr;
  _kjCondition._32_8_ = func;
  rest_local.ptr = in_R9;
  f.exception = (Exception *)
                kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                           (Maybe<kj::Promise<void>_> *)(func + 2));
  kj::_::DebugExpression<kj::Maybe<kj::Promise<void>>&>::operator==
            ((DebugComparison<kj::Maybe<kj::Promise<void>_>_&,_const_kj::None_&> *)local_60,
             (DebugExpression<kj::Maybe<kj::Promise<void>>&> *)&f,(None *)&kj::none);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_60);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::Promise<void>>&,kj::None_const&>&,char_const(&)[31]>
              ((Fault *)(local_98 + 0x28),
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls.c++"
               ,0x16d,FAILED,"shutdownTask == kj::none",
               "_kjCondition,\"already called shutdownWrite()\"",
               (DebugComparison<kj::Maybe<kj::Promise<void>_>_&,_const_kj::None_&> *)local_60,
               (char (*) [31])"already called shutdownWrite()");
    kj::_::Debug::Fault::fatal((Fault *)(local_98 + 0x28));
  }
  while( true ) {
    sVar2 = ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&rest_local.size_);
    if (sVar2 != 0) {
      sslCall<kj::TlsConnection::writeInternal(kj::ArrayPtr<unsigned_char_const>,kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>)::_lambda()_1_>
                ((TlsConnection *)local_98,func);
      Promise<unsigned_long>::
      then<kj::TlsConnection::writeInternal(kj::ArrayPtr<unsigned_char_const>,kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>)::_lambda(unsigned_long)_1_>
                ((Promise<unsigned_long> *)this,(Type *)local_98);
      Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)local_98);
      return (PromiseBase)(PromiseBase)this;
    }
    sVar2 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::size
                      ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local);
    if (sVar2 == 0) break;
    pAVar3 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::front
                       ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local);
    rest_local.size_ = (size_t)pAVar3->ptr;
    sVar2 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::size
                      ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local);
    local_98._8_16_ =
         (undefined1  [16])
         ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::slice
                   ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local,1,sVar2);
    this_local = (TlsConnection *)local_98._8_8_;
    rest_local.ptr = (ArrayPtr<const_unsigned_char> *)local_98._16_8_;
  }
  kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<void> writeInternal(kj::ArrayPtr<const byte> first,
                              kj::ArrayPtr<const kj::ArrayPtr<const byte>> rest) {
    KJ_REQUIRE(shutdownTask == kj::none, "already called shutdownWrite()");

    // SSL_write() with a zero-sized input returns 0, but a 0 return is documented as indicating
    // an error. So, we need to avoid zero-sized writes entirely.
    while (first.size() == 0) {
      if (rest.size() == 0) {
        return kj::READY_NOW;
      }
      first = rest.front();
      rest = rest.slice(1, rest.size());
    }

    return sslCall([this,first]() { return SSL_write(ssl, first.begin(), first.size()); })
        .then([this,first,rest](size_t n) -> kj::Promise<void> {
      if (n == 0) {
        return KJ_EXCEPTION(DISCONNECTED, "ssl connection ended during write");
      } else if (n < first.size()) {
        return writeInternal(first.slice(n, first.size()), rest);
      } else if (rest.size() > 0) {
        return writeInternal(rest[0], rest.slice(1, rest.size()));
      } else {
        return kj::READY_NOW;
      }
    });
  }